

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O3

int ngram_fwdtree_reinit(ngram_search_t *ngs)

{
  lastphn_cand_t *plVar1;
  chan_t **ppcVar2;
  
  reinit_search_tree(ngs);
  deinit_search_tree(ngs);
  ckd_free(ngs->lastphn_cand);
  plVar1 = (lastphn_cand_t *)
           __ckd_calloc__((long)(ngs->base).n_words,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x1cb);
  ngs->lastphn_cand = plVar1;
  ckd_free(ngs->word_chan);
  ppcVar2 = (chan_t **)
            __ckd_calloc__((long)(ngs->base).n_words,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                           ,0x1ce);
  ngs->word_chan = ppcVar2;
  init_search_tree(ngs);
  create_search_channels(ngs);
  return 0;
}

Assistant:

int
ngram_fwdtree_reinit(ngram_search_t *ngs)
{
    /* Reset non-root channels. */
    reinit_search_tree(ngs);
    /* Free the search tree. */
    deinit_search_tree(ngs);
    /* Reallocate things that depend on the number of words. */
    ckd_free(ngs->lastphn_cand);
    ngs->lastphn_cand = ckd_calloc(ps_search_n_words(ngs),
                                   sizeof(*ngs->lastphn_cand));
    ckd_free(ngs->word_chan);
    ngs->word_chan = ckd_calloc(ps_search_n_words(ngs),
                                sizeof(*ngs->word_chan));
    /* Rebuild the search tree. */
    init_search_tree(ngs);
    create_search_channels(ngs);
    return 0;
}